

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::become_follower(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  __node_base *p_Var3;
  uint64_t my_term;
  Param param;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&param,"[BECOME FOLLOWER] term %lu",
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_follower",0x525,(string *)&param);
      std::__cxx11::string::~string((string *)&param);
    }
  }
  std::mutex::lock(&this->cli_lock_);
  p_Var3 = &(this->peers_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    peer::enable_hb(*(peer **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor,false);
  }
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
  LOCK();
  (this->role_)._M_i = follower;
  UNLOCK();
  param.myId = this->id_;
  param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
  param.peerId = -1;
  my_term = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
  param.ctx = &my_term;
  cb_func::call((cb_func *)
                ((this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl + 0x70),BecomeFollower
                ,&param);
  LOCK();
  (this->write_paused_)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->initialized_)._M_base._M_i = true;
  UNLOCK();
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->uncommitted_config_).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
  LOCK();
  (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  drop_all_pending_commit_elems(this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->cli_lock_);
  restart_election_timer(this);
  return;
}

Assistant:

void raft_server::become_follower() {
    // stop hb for all peers
    p_in("[BECOME FOLLOWER] term %" PRIu64 "", state_->get_term());
    {   std::lock_guard<std::mutex> ll(cli_lock_);
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            it->second->enable_hb(false);
        }

        srv_to_join_.reset();
        role_ = srv_role::follower;

        cb_func::Param param(id_, leader_);
        uint64_t my_term = state_->get_term();
        param.ctx = &my_term;
        (void) ctx_->cb_func_.call(cb_func::BecomeFollower, &param);

        write_paused_ = false;
        next_leader_candidate_ = -1;
        initialized_ = true;
        uncommitted_config_.reset();
        pre_vote_.quorum_reject_count_ = 0;
        pre_vote_.failure_count_ = 0;

        // Drain all pending callback functions.
        drop_all_pending_commit_elems();
    }

    restart_election_timer();
}